

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscenebsptreeindex.cpp
# Opt level: O0

void __thiscall
QGraphicsSceneBspTreeIndex::~QGraphicsSceneBspTreeIndex(QGraphicsSceneBspTreeIndex *this)

{
  QGraphicsSceneBspTreeIndexPrivate *pQVar1;
  QList<QGraphicsItem_*> *this_00;
  qsizetype qVar2;
  const_reference ppQVar3;
  QGraphicsItemPrivate *pQVar4;
  undefined8 *in_RDI;
  QGraphicsItem *item;
  int i;
  QGraphicsSceneBspTreeIndexPrivate *d;
  qsizetype in_stack_ffffffffffffffc8;
  int local_14;
  
  *in_RDI = &PTR_metaObject_00d348e0;
  pQVar1 = d_func((QGraphicsSceneBspTreeIndex *)0xa1f1ba);
  local_14 = 0;
  while( true ) {
    this_00 = (QList<QGraphicsItem_*> *)(long)local_14;
    qVar2 = QList<QGraphicsItem_*>::size(&pQVar1->indexedItems);
    if (qVar2 <= (long)this_00) break;
    ppQVar3 = QList<QGraphicsItem_*>::at(this_00,in_stack_ffffffffffffffc8);
    if (*ppQVar3 != (QGraphicsItem *)0x0) {
      pQVar4 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
               operator->(&(*ppQVar3)->d_ptr);
      pQVar4->index = -1;
    }
    local_14 = local_14 + 1;
  }
  QGraphicsSceneIndex::~QGraphicsSceneIndex((QGraphicsSceneIndex *)0xa1f246);
  return;
}

Assistant:

QGraphicsSceneBspTreeIndex::~QGraphicsSceneBspTreeIndex()
{
    Q_D(QGraphicsSceneBspTreeIndex);
    for (int i = 0; i < d->indexedItems.size(); ++i) {
        // Ensure item bits are reset properly.
        if (QGraphicsItem *item = d->indexedItems.at(i)) {
            Q_ASSERT(!item->d_ptr->itemDiscovered);
            item->d_ptr->index = -1;
        }
    }
}